

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O3

void __thiscall Js::DelayedFreeArrayBuffer::ClearAll(DelayedFreeArrayBuffer *this)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *pSVar5;
  Type *ppAVar6;
  Iterator local_40;
  
  if ((DelayedFreeArrayBuffer *)
      (this->listOfBuffers).
      super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
      super_SListNodeBase<Memory::HeapAllocator>.next != this) {
    local_40.list =
         (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
         this;
    local_40.current = (NodeBase *)this;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pSVar5 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              *)this;
    while( true ) {
      if (pSVar5 == (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                     *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        pSVar5 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                  *)local_40.current;
      }
      pSVar5 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                *)(((DelayedFreeBufferType *)&pSVar5->super_SListNodeBase<Memory::HeapAllocator>)->
                  super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                  ).super_SListNodeBase<Memory::HeapAllocator>.next;
      if (pSVar5 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar5;
      ppAVar6 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                ::Iterator::Data(&local_40);
      pAVar1 = *ppAVar6;
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[2])(pAVar1);
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[7])(pAVar1);
      pSVar5 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                *)local_40.current;
    }
    SList<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::Clear
              (&this->listOfBuffers);
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ClearAll()
    {
        if (HasAnyItem())
        {
            this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
                item->Release();
                item->ClearSelfOnly();
            });

            this->listOfBuffers.Clear();
        }
    }